

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::DescriptorProto::InternalSerializeWithCachedSizesToArray
          (DescriptorProto *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar1;
  string *psVar2;
  MessageOptions *this_01;
  char *data;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  Type *pTVar6;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  Type *this_06;
  Type *pTVar7;
  uint8 *puVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  byte *pbVar12;
  
  uVar10 = (this->_has_bits_).has_bits_[0];
  if ((uVar10 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.DescriptorProto.name");
    psVar2 = (this->name_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  iVar1 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->field_).super_RepeatedPtrFieldBase,iVar11);
      *target = '\x12';
      pbVar12 = target + 1;
      uVar5 = pTVar6->_cached_size_;
      uVar9 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar12 = (byte)uVar5 | 0x80;
          uVar9 = uVar5 >> 7;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar9;
        } while (bVar4);
      }
      *pbVar12 = (byte)uVar9;
      target = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (pTVar6,deterministic,pbVar12 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  iVar1 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      this_02 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar11);
      *target = '\x1a';
      pbVar12 = target + 1;
      uVar5 = this_02->_cached_size_;
      uVar9 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar12 = (byte)uVar5 | 0x80;
          uVar9 = uVar5 >> 7;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar9;
        } while (bVar4);
      }
      *pbVar12 = (byte)uVar9;
      target = InternalSerializeWithCachedSizesToArray(this_02,deterministic,pbVar12 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  iVar1 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      this_03 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                          (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar11);
      *target = '\"';
      pbVar12 = target + 1;
      uVar5 = this_03->_cached_size_;
      uVar9 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar12 = (byte)uVar5 | 0x80;
          uVar9 = uVar5 >> 7;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar9;
        } while (bVar4);
      }
      *pbVar12 = (byte)uVar9;
      target = EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_03,deterministic,pbVar12 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  iVar1 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      this_04 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                          (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar11);
      *target = '*';
      pbVar12 = target + 1;
      uVar5 = this_04->_cached_size_;
      uVar9 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar12 = (byte)uVar5 | 0x80;
          uVar9 = uVar5 >> 7;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar9;
        } while (bVar4);
      }
      *pbVar12 = (byte)uVar9;
      target = DescriptorProto_ExtensionRange::InternalSerializeWithCachedSizesToArray
                         (this_04,false,pbVar12 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  iVar1 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->extension_).super_RepeatedPtrFieldBase,iVar11);
      *target = '2';
      pbVar12 = target + 1;
      uVar5 = pTVar6->_cached_size_;
      uVar9 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar12 = (byte)uVar5 | 0x80;
          uVar9 = uVar5 >> 7;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar9;
        } while (bVar4);
      }
      *pbVar12 = (byte)uVar9;
      target = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (pTVar6,deterministic,pbVar12 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  if ((uVar10 & 2) != 0) {
    this_01 = this->options_;
    *target = ':';
    pbVar12 = target + 1;
    uVar10 = this_01->_cached_size_;
    uVar5 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar12 = (byte)uVar10 | 0x80;
        uVar5 = uVar10 >> 7;
        pbVar12 = pbVar12 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar5;
      } while (bVar4);
    }
    *pbVar12 = (byte)uVar5;
    target = MessageOptions::InternalSerializeWithCachedSizesToArray
                       (this_01,deterministic,pbVar12 + 1);
  }
  iVar1 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      this_05 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                          (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar11);
      *target = 'B';
      pbVar12 = target + 1;
      uVar10 = this_05->_cached_size_;
      uVar5 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar12 = (byte)uVar10 | 0x80;
          uVar5 = uVar10 >> 7;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar5;
        } while (bVar4);
      }
      *pbVar12 = (byte)uVar5;
      target = OneofDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_05,deterministic,pbVar12 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  iVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      this_06 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                          (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar11);
      *target = 'J';
      pbVar12 = target + 1;
      uVar10 = this_06->_cached_size_;
      uVar5 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar12 = (byte)uVar10 | 0x80;
          uVar5 = uVar10 >> 7;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar5;
        } while (bVar4);
      }
      *pbVar12 = (byte)uVar5;
      target = DescriptorProto_ReservedRange::InternalSerializeWithCachedSizesToArray
                         (this_06,false,pbVar12 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  iVar1 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    this_00 = &this->reserved_name_;
    iVar11 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar11);
      data = (pTVar7->_M_dataplus)._M_p;
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar11);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar7->_M_string_length,SERIALIZE,
                 "google.protobuf.DescriptorProto.reserved_name");
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar11);
      *target = 'R';
      target = io::CodedOutputStream::WriteStringWithSizeToArray(pTVar7,target + 1);
      iVar11 = iVar11 + 1;
    } while (iVar1 != iVar11);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar8 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar8;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* DescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0, n = this->field_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->field(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0, n = this->nested_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, this->nested_type(i), deterministic, target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, this->enum_type(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0, n = this->extension_range_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, this->extension_range(i), deterministic, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->extension(i), deterministic, target);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, *this->options_, deterministic, target);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0, n = this->oneof_decl_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, this->oneof_decl(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0, n = this->reserved_range_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, this->reserved_range(i), deterministic, target);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->reserved_name_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->reserved_name(i).data(), this->reserved_name(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(10, this->reserved_name(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}